

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall
Mesh::Mesh(Mesh *this,vector<float,_std::allocator<float>_> *vertices,
          vector<float,_std::allocator<float>_> *normals,
          vector<float,_std::allocator<float>_> *texCoords,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,int32_t positionLoc,
          int32_t normalLoc,int32_t texCoordLoc)

{
  iterator pBVar1;
  iterator pBVar2;
  element_type *peVar3;
  VertexArray *this_00;
  shared_ptr<VertexBuffer> vboTexels;
  shared_ptr<VertexBuffer> vboNormals;
  shared_ptr<VertexBuffer> vboVertices;
  BufferLayout local_a8;
  initializer_list<BufferElement> local_88;
  initializer_list<BufferElement> local_78;
  VertexArray *local_68;
  initializer_list<BufferElement> local_60;
  shared_ptr<VertexBuffer> local_50;
  undefined8 local_3c;
  undefined1 local_34;
  
  this->m_vertices = 0;
  this->m_indices = 0;
  this->m_positionLoc = positionLoc;
  this->m_normalLoc = normalLoc;
  this->m_texCoordLoc = texCoordLoc;
  local_68 = &this->m_vao;
  VertexArray::VertexArray(local_68);
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indicesData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_verticesData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_drawMode = 4;
  local_78._M_array =
       (iterator)
       (vertices->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)(vertices->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)local_78._M_array);
  this->m_vertices =
       (uint32_t)
       ((ulong)((long)local_a8.elements.
                      super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) / 3);
  local_50.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<VertexBuffer,std::allocator<VertexBuffer>,unsigned_long,float_const*>
            (&local_50.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (VertexBuffer **)&local_50,(allocator<VertexBuffer> *)&local_88,
             (unsigned_long *)&local_a8,(float **)&local_78);
  peVar3 = local_50.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88._M_array = (iterator)0x3;
  local_88._M_len = local_88._M_len & 0xffffffffffffff00;
  local_78._M_len = 1;
  local_78._M_array = (iterator)&local_88;
  BufferLayout::BufferLayout(&local_a8,&local_78,false);
  std::vector<BufferElement,_std::allocator<BufferElement>_>::operator=
            (&(peVar3->m_layout).elements,&local_a8.elements);
  (peVar3->m_layout).unpacked = local_a8.unpacked;
  *(undefined3 *)&(peVar3->m_layout).field_0x19 = local_a8._25_3_;
  (peVar3->m_layout).stride = local_a8.stride;
  if (local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.elements.
                    super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.elements.
                          super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.elements.
                          super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_88._M_array =
       (iterator)
       (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)(normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)local_88._M_array);
  local_78._M_array = (iterator)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<VertexBuffer,std::allocator<VertexBuffer>,unsigned_long,float_const*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_len,
             (VertexBuffer **)&local_78,(allocator<VertexBuffer> *)&local_60,
             (unsigned_long *)&local_a8,(float **)&local_88);
  pBVar1 = local_78._M_array;
  local_60._M_array = (iterator)0x3;
  local_60._M_len = local_60._M_len & 0xffffffffffffff00;
  local_88._M_len = 1;
  local_88._M_array = (iterator)&local_60;
  BufferLayout::BufferLayout(&local_a8,&local_88,false);
  std::vector<BufferElement,_std::allocator<BufferElement>_>::operator=
            ((vector<BufferElement,_std::allocator<BufferElement>_> *)&pBVar1->normalized,
             &local_a8.elements);
  *(undefined8 *)&pBVar1[2].normalized = local_a8._24_8_;
  if (local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.elements.
                    super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.elements.
                          super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.elements.
                          super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_60._M_array =
       (iterator)
       (texCoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)(texCoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)local_60._M_array);
  local_88._M_array = (iterator)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<VertexBuffer,std::allocator<VertexBuffer>,unsigned_long,float_const*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_len,
             (VertexBuffer **)&local_88,(allocator<VertexBuffer> *)&local_3c,
             (unsigned_long *)&local_a8,(float **)&local_60);
  pBVar1 = local_88._M_array;
  local_3c = 2;
  local_34 = 0;
  local_60._M_len = 1;
  local_60._M_array = (iterator)&local_3c;
  BufferLayout::BufferLayout(&local_a8,&local_60,false);
  std::vector<BufferElement,_std::allocator<BufferElement>_>::operator=
            ((vector<BufferElement,_std::allocator<BufferElement>_> *)&pBVar1->normalized,
             &local_a8.elements);
  *(undefined8 *)&pBVar1[2].normalized = local_a8._24_8_;
  if (local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.elements.
                    super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.elements.
                          super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.elements.
                          super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this_00 = local_68;
  VertexArray::add_vertex_buffer(local_68,&local_50,false);
  VertexArray::add_vertex_buffer(this_00,(shared_ptr<VertexBuffer> *)&local_78,false);
  VertexArray::add_vertex_buffer(this_00,(shared_ptr<VertexBuffer> *)&local_88,false);
  pBVar1 = (iterator)
           (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2 = (iterator)
           (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar1 != pBVar2) {
    this->m_indices = (uint32_t)((ulong)((long)pBVar2 - (long)pBVar1) >> 2);
    local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_60._M_array = pBVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<IndexBuffer,std::allocator<IndexBuffer>,unsigned_int&,unsigned_int_const*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>.
                _M_impl.super__Vector_impl_data._M_finish,(IndexBuffer **)&local_a8,
               (allocator<IndexBuffer> *)&local_3c,&this->m_indices,(uint **)&local_60);
    VertexArray::set_index_buffer(this_00,(shared_ptr<IndexBuffer> *)&local_a8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_len !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_len);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_len !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_len);
  }
  if (local_50.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

Mesh::Mesh(const std::vector<float>& vertices,
           const std::vector<float>& normals,
           const std::vector<float>& texCoords,
           const std::vector<uint32_t>& indices,
           int32_t positionLoc,
           int32_t normalLoc  ,
           int32_t texCoordLoc)
  : m_vertices(0),
    m_indices(0),
    m_positionLoc(positionLoc),
    m_normalLoc(normalLoc),
    m_texCoordLoc(texCoordLoc),
    m_drawMode(GL_TRIANGLES)
{
    // Assumes triangles as draw primitive
    m_vertices = vertices.size() / 3;

    // buffer for vertices
    // buffer for normals
    // buffer for texcoords

    auto vboVertices = std::make_shared<VertexBuffer>(
         vertices.size() * sizeof(float), vertices.data());
    vboVertices->set_layout(BufferLayout({{ElementType::Float3, "position"}}));

    auto vboNormals = std::make_shared<VertexBuffer>(
         normals.size() * sizeof(float), normals.data());
    vboNormals->set_layout(BufferLayout({{ElementType::Float3, "normal"}}));

    auto vboTexels = std::make_shared<VertexBuffer>(
        texCoords.size() * sizeof(float), texCoords.data());
    vboTexels->set_layout(BufferLayout({{ElementType::Float2, "texCoord"}}));
 
    m_vao.add_vertex_buffer(vboVertices);
    m_vao.add_vertex_buffer(vboNormals);
    m_vao.add_vertex_buffer(vboTexels);

    if (!indices.empty())
    {
        m_indices = indices.size();
        auto ibo = std::make_shared<IndexBuffer>(m_indices, indices.data());
        m_vao.set_index_buffer(ibo);
    }
}